

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

void ncnn_convert_packing(ncnn_mat_t src,ncnn_mat_t *dst,int elempack,ncnn_option_t opt)

{
  undefined8 *puVar1;
  undefined8 *in_RSI;
  Mat _dst;
  int in_stack_ffffffffffffff24;
  Mat *in_stack_ffffffffffffff28;
  undefined8 uVar2;
  
  uVar2._0_1_ = false;
  uVar2._1_1_ = false;
  uVar2._2_1_ = false;
  uVar2._3_1_ = false;
  uVar2._4_4_ = 0;
  ncnn::convert_packing
            ((Mat *)0x0,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
             (Option *)&stack0xffffffffffffff30);
  puVar1 = (undefined8 *)operator_new(0x48);
  *puVar1 = uVar2;
  puVar1[1] = 0;
  puVar1[2] = 0;
  *(undefined4 *)(puVar1 + 3) = 0;
  puVar1[4] = 0;
  *(undefined4 *)(puVar1 + 5) = 0;
  *(undefined4 *)((long)puVar1 + 0x2c) = 0;
  *(undefined4 *)(puVar1 + 6) = 0;
  *(undefined4 *)((long)puVar1 + 0x34) = 0;
  *(undefined4 *)(puVar1 + 7) = 0;
  puVar1[8] = 0;
  if (puVar1[1] != 0) {
    LOCK();
    *(int *)puVar1[1] = *(int *)puVar1[1] + 1;
    UNLOCK();
  }
  *in_RSI = puVar1;
  return;
}

Assistant:

void ncnn_convert_packing(const ncnn_mat_t src, ncnn_mat_t* dst, int elempack, const ncnn_option_t opt)
{
    Mat _dst;
    ncnn::convert_packing(*(const Mat*)src, _dst, elempack, *(Option*)opt);
    *dst = (ncnn_mat_t)(new Mat(_dst));
}